

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_dstore(ExecutionEngine *this)

{
  u2 uVar1;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar2;
  Value VVar3;
  undefined4 local_70;
  Value padding;
  ushort local_4c;
  u1 byte2;
  int16_t index;
  u1 byte1;
  u1 *code;
  ValueType VStack_2c;
  Value value;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar3 = Frame::popTopOfOperandStack(this_01);
  VStack_2c = VVar3.type;
  if (VStack_2c != DOUBLE) {
    __assert_fail("value.type == ValueType::DOUBLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x4d5,"void ExecutionEngine::i_dstore()");
  }
  Frame::popTopOfOperandStack(this_01);
  puVar2 = Frame::getCode(this_01,this_01->pc);
  local_4c = (ushort)puVar2[1];
  if ((this->_isWide & 1U) == 0) {
    this_01->pc = this_01->pc + 2;
  }
  else {
    local_4c = CONCAT11(puVar2[1],puVar2[2]);
    this_01->pc = this_01->pc + 3;
    this->_isWide = false;
  }
  uVar1 = Frame::sizeLocalVariables(this_01);
  if ((short)local_4c + 1 < (int)(short)uVar1) {
    Frame::changeLocalVariable(this_01,VVar3,(int)(short)local_4c);
    VVar3.type = 10;
    VVar3.printType = local_70;
    VVar3.data = (anon_union_8_10_52016fac_for_data)padding._0_8_;
    Frame::changeLocalVariable(this_01,VVar3,(int)(short)local_4c + 1);
    return;
  }
  __assert_fail("((int16_t)(topFrame->sizeLocalVariables()) > (index + 1))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x4e5,"void ExecutionEngine::i_dstore()");
}

Assistant:

void ExecutionEngine::i_dstore() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value = topFrame->popTopOfOperandStack();
	assert(value.type == ValueType::DOUBLE);
	topFrame->popTopOfOperandStack(); //padding

	u1 *code = topFrame->getCode(topFrame->pc);
	u1 byte1 = code[1]; //índice do vetor de variáveis locais
	int16_t index = (int16_t)byte1;

	if (_isWide) {
		u1 byte2 = code[2];
		index = (byte1 << 8) | byte2;
		topFrame->pc += 3;
		_isWide = false;
	} else {
		topFrame->pc += 2;
	}

	assert(((int16_t)(topFrame->sizeLocalVariables()) > (index + 1)));
	topFrame->changeLocalVariable(value, index);
	Value padding;
	padding.type = ValueType::PADDING;
	topFrame->changeLocalVariable(padding, index + 1);
}